

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

void ctemplate::TemplateDictionary::SetGlobalValue(TemplateString variable,TemplateString value)

{
  TemplateString key;
  TemplateString value_00;
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::small_map_default_init<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>_>_>_>
  *m;
  undefined8 in_stack_00000008;
  TemplateString local_58;
  undefined8 local_38;
  char *pcStack_30;
  size_t local_28;
  TemplateId TStack_20;
  MutexLock local_18;
  MutexLock ml;
  char *value_copy;
  
  ml.mu_ = (Mutex *)operator_new__((ulong)(value.ptr_ + 1));
  memcpy(ml.mu_,(void *)variable.id_,(size_t)value.ptr_);
  value.ptr_[(long)&(ml.mu_)->mutex_] = '\0';
  GoogleOnceInit(&g_once,SetupGlobalDict);
  MutexLock::MutexLock(&local_18,(Mutex *)&g_static_mutex);
  m = global_dict_;
  local_38 = in_stack_00000008;
  pcStack_30 = variable.ptr_;
  local_28 = variable.length_;
  TStack_20 = variable._16_8_;
  TemplateString::TemplateString(&local_58,(char *)ml.mu_,(size_t)value.ptr_);
  key.length_ = (size_t)pcStack_30;
  key.ptr_ = (char *)local_38;
  key._16_8_ = local_28;
  key.id_ = TStack_20;
  value_00.length_ = local_58.length_;
  value_00.ptr_ = local_58.ptr_;
  value_00.is_immutable_ = local_58.is_immutable_;
  value_00._17_7_ = local_58._17_7_;
  value_00.id_ = local_58.id_;
  HashInsert<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>,4,std::equal_to<unsigned_long>,ctemplate::small_map_default_init<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,ctemplate::TemplateString>>>>>,ctemplate::TemplateString>
            (m,key,value_00);
  MutexLock::~MutexLock(&local_18);
  return;
}

Assistant:

LOCKS_EXCLUDED(g_static_mutex) {
  // We can't use memdup here, since we're a static method.  We do a strdup,
  // which is fine, since global_dict_ lives the entire program anyway.
  // It's unnecessary to copy the variable, since HashInsert takes care of
  // that for us.
  char* value_copy = new char[value.length_ + 1];
  memcpy(value_copy, value.ptr_, value.length_);
  value_copy[value.length_] = '\0';

  GoogleOnceInit(&g_once, &SetupGlobalDict);

  MutexLock ml(&g_static_mutex);
  HashInsert(global_dict_,
             variable,
             TemplateString(value_copy, value.length_));
}